

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O0

void __thiscall DataFileTest::testSchemaReadWrite(DataFileTest *this)

{
  bool bVar1;
  size_t __n;
  void *__buf;
  void *__buf_00;
  ValidSchema *in_RDI;
  uint32_t b;
  DataFileReader<unsigned_int> df_1;
  DataFileWriter<unsigned_int> df;
  uint32_t a;
  basic_cstring<const_char> *in_stack_ffffffffffffff40;
  lazy_ostream *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  DataFileReader<unsigned_int> *this_00;
  DataFileWriter<unsigned_int> *this_01;
  DataFileWriter<unsigned_int> *in_stack_ffffffffffffff70;
  const_string *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  const_string *in_stack_ffffffffffffff88;
  unit_test_log_t *in_stack_ffffffffffffff90;
  basic_cstring<const_char> local_48;
  undefined1 local_34 [4];
  DataFileReader<unsigned_int> local_30 [3];
  DataFileWriter<unsigned_int> local_18;
  undefined4 local_c;
  
  local_c = 0x2a;
  this_01 = &local_18;
  __n = 0x4000;
  avro::DataFileWriter<unsigned_int>::DataFileWriter
            (in_stack_ffffffffffffff70,(char *)this_01,in_RDI,in_stack_ffffffffffffff58,
             (Codec)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  avro::DataFileWriter<unsigned_int>::write(this_01,(int)&stack0xfffffffffffffff4,__buf,__n);
  avro::DataFileWriter<unsigned_int>::~DataFileWriter((DataFileWriter<unsigned_int> *)0x24a2f9);
  this_00 = local_30;
  avro::DataFileReader<unsigned_int>::DataFileReader
            ((DataFileReader<unsigned_int> *)in_RDI,(char *)this_00);
  avro::DataFileReader<unsigned_int>::read(this_00,(int)local_34,__buf_00,__n);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
               ,0x70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffff40);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffff48,(char (*) [1])in_stack_ffffffffffffff40);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&stack0xffffffffffffff70,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
               ,0x70);
    in_stack_ffffffffffffff48 = (lazy_ostream *)0x2b1cc5;
    in_stack_ffffffffffffff40 = (basic_cstring<const_char> *)&stack0xfffffffffffffff4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&stack0xffffffffffffff80,&stack0xffffffffffffff70,0x1c0,1,2,local_34,"b");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x24a404);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::DataFileReader<unsigned_int>::~DataFileReader((DataFileReader<unsigned_int> *)0x24a41e);
  return;
}

Assistant:

void testSchemaReadWrite() {
    uint32_t a=42;
    {
            avro::DataFileWriter<uint32_t> df(filename, writerSchema);
        df.write(a);    
        }

        {
        avro::DataFileReader<uint32_t> df(filename);
        uint32_t b;
            df.read(b);
            BOOST_CHECK_EQUAL(b, a);
    }
    }